

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void * parse_end(Parser *parser)

{
  Kind KVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  void *object;
  void *pvVar5;
  ArraySubscript *pAVar6;
  EndTerm *pEVar7;
  List *args;
  Token *el;
  SelectMember *pSVar8;
  CallTerm *pCVar9;
  undefined8 *unaff_RBX;
  Token *op;
  KindMeta KVar10;
  
  object = parse_constant(parser);
  op = parser->token;
  KVar1 = op->kind;
  if ((int)KVar1 < 0xaf) {
    if (KVar1 == AND) {
      pEVar7 = new_end_term(op,object);
      return pEVar7;
    }
    if (KVar1 == OP_BRA) {
      move(parser);
      args = new_list();
      while (parser->token->kind != CL_BRA) {
        pvVar5 = parse_logic(parser);
        list_add(args,pvVar5);
        move(parser);
        KVar1 = parser->token->kind;
        if (KVar1 != CL_BRA) {
          if (KVar1 == COMM) {
            move(parser);
          }
          else {
            log_debug(
                     "/workspace/llm4binary/github/license_all_cmakelists_25/editso[P]timely-lang/parser.c:666"
                     );
            pcVar4 = parser->lexer->source;
            uVar2 = parser->token->col_pos;
            uVar3 = parser->token->row_pos;
            KVar10 = get_kind_meta(op->kind);
            log_code(pcVar4,uVar3,uVar2,"Illegal expression: %s",KVar10.name);
          }
        }
      }
      expect(parser,CL_BRA);
      pCVar9 = new_call_term(object,args);
      return pCVar9;
    }
    if (KVar1 == OP_SQ_BRA) {
      move(parser);
      pvVar5 = parse_logic(parser);
      expect(parser,CL_FL_BRA);
      pAVar6 = new_array_subscript(object,pvVar5);
      return pAVar6;
    }
  }
  else {
    if (KVar1 != SUB2) {
      if (KVar1 == DO) {
        move(parser);
        el = lexer_read(parser->lexer);
        stack_push(parser->stack,el);
        if (el->kind != ID) {
          log_debug(
                   "/workspace/llm4binary/github/license_all_cmakelists_25/editso[P]timely-lang/parser.c:676"
                   );
          pcVar4 = parser->lexer->source;
          uVar2 = parser->token->col_pos;
          uVar3 = parser->token->row_pos;
          KVar10 = get_kind_meta(op->kind);
          log_code(pcVar4,uVar3,uVar2,"Illegal expression: %s",KVar10.name);
        }
        pvVar5 = parse_logic(parser);
        pSVar8 = new_select_member(object,pvVar5);
        return pSVar8;
      }
      if (KVar1 != AND2) {
        return object;
      }
    }
    pEVar7 = (EndTerm *)0x0;
    while ((op->kind == SUB2 || (op->kind == AND2))) {
      op = parser->token;
      move(parser);
      if (pEVar7 == (EndTerm *)0x0) {
        pEVar7 = new_end_term(op,(void *)0x0);
        unaff_RBX = (undefined8 *)pEVar7->expr;
      }
      else {
        pEVar7 = new_end_term(op,pEVar7);
      }
    }
    if (pEVar7 != (EndTerm *)0x0) {
      *unaff_RBX = object;
      do {
      } while( true );
    }
    object = (void *)0x0;
  }
  return object;
}

Assistant:

void *parse_end(Parser *parser) {
    void *left = parse_constant(parser);
    Token *tok = token(parser);
    switch (g_kind(tok)) {
        case AND2:
        case SUB2: {
            // ++, ----
            EndTerm *end = NULL;
            void **p;
            while (true) {
                switch (g_kind(tok)) {
                    case AND2:
                    case SUB2:
                        tok = token(parser);
                        move(parser);
                        if (end == NULL) {
                            end = new_end_term(tok, NULL);
                            p = end->expr;
                        } else {
                            end = new_end_term(tok, end);
                        }
                        continue;
                    default:
                        break;
                }
                if (end != NULL) {
                    *p = left;
                } else {
                    break;
                }
            }
            return end;
        }
        case AND:
            return new_end_term(tok, left);
        case OP_SQ_BRA: {
            move(parser);
            void *expr = parse_expr(parser);
            expect(parser, CL_FL_BRA);
            return new_array_subscript(left, expr);
        }
        case OP_BRA: {
            move(parser);
            List *args = new_list();
            while (token(parser)->kind != CL_BRA) {
                list_add(args, parse_expr(parser));
                move(parser);
                if (token(parser)->kind == COMM) {
                    move(parser);
                    continue;
                }
                if (token(parser)->kind != CL_BRA) {
                    
                    parse_error(parser, "Illegal expression: %s", get_kind_meta(tok->kind).name);
                }
            }
            expect(parser, CL_BRA);
            return new_call_term(left, args);
        }
        case DO: {
            move(parser);
            if (peek(parser)->kind != ID) {
                
                parse_error(parser, "Illegal expression: %s", get_kind_meta(tok->kind).name);
            }
            return new_select_member(left, parse_expr(parser));
        }
        default:
            return left;
    }
}